

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O3

void __thiscall leveldb::VersionSet::SetupOtherInputs(VersionSet *this,Compaction *c)

{
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *compaction_files;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint level;
  pointer ppFVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded0;
  InternalKey largest;
  InternalKey new_start;
  InternalKey all_limit;
  InternalKey all_start;
  InternalKey new_limit;
  InternalKey smallest;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded1;
  
  level = c->level_;
  smallest.rep_._M_dataplus._M_p = (pointer)&smallest.rep_.field_2;
  smallest.rep_._M_string_length = 0;
  smallest.rep_.field_2._M_local_buf[0] = '\0';
  largest.rep_._M_dataplus._M_p = (pointer)&largest.rep_.field_2;
  largest.rep_._M_string_length = 0;
  largest.rep_.field_2._M_local_buf[0] = '\0';
  compaction_files = c->inputs_;
  AddBoundaryInputs(&this->icmp_,this->current_->files_ + (int)level,compaction_files);
  GetRange(this,compaction_files,&smallest,&largest);
  inputs = c->inputs_ + 1;
  Version::GetOverlappingInputs(this->current_,level + 1,&smallest,&largest,inputs);
  all_start.rep_._M_dataplus._M_p = (pointer)&all_start.rep_.field_2;
  all_start.rep_._M_string_length = 0;
  all_start.rep_.field_2._M_local_buf[0] = '\0';
  all_limit.rep_._M_dataplus._M_p = (pointer)&all_limit.rep_.field_2;
  all_limit.rep_._M_string_length = 0;
  all_limit.rep_.field_2._M_local_buf[0] = '\0';
  GetRange2(this,compaction_files,inputs,&all_start,&all_limit);
  if (c->inputs_[1].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      c->inputs_[1].
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    expanded0.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    expanded0.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    expanded0.super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Version::GetOverlappingInputs(this->current_,level,&all_start,&all_limit,&expanded0);
    AddBoundaryInputs(&this->icmp_,this->current_->files_ + (int)level,&expanded0);
    ppFVar2 = c->inputs_[0].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    uVar3 = (long)c->inputs_[0].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2;
    if (uVar3 == 0) {
      lVar5 = 0;
    }
    else {
      lVar6 = 0;
      lVar5 = 0;
      do {
        lVar5 = lVar5 + ppFVar2[lVar6]->file_size;
        lVar6 = lVar6 + 1;
      } while (((long)uVar3 >> 3) + (ulong)((long)uVar3 >> 3 == 0) != lVar6);
    }
    ppFVar2 = c->inputs_[1].
              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)c->inputs_[1].
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar2;
    if (lVar6 == 0) {
      lVar8 = 0;
    }
    else {
      lVar6 = lVar6 >> 3;
      lVar7 = 0;
      lVar8 = 0;
      do {
        lVar8 = lVar8 + ppFVar2[lVar7]->file_size;
        lVar7 = lVar7 + 1;
      } while (lVar6 + (ulong)(lVar6 == 0) != lVar7);
    }
    uVar4 = (long)expanded0.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)expanded0.
                  super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (uVar4 == 0) {
      lVar6 = 0;
    }
    else {
      lVar7 = 0;
      lVar6 = 0;
      do {
        lVar6 = lVar6 + expanded0.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar7]->file_size;
        lVar7 = lVar7 + 1;
      } while (((long)uVar4 >> 3) + (ulong)((long)uVar4 >> 3 == 0) != lVar7);
    }
    if ((uVar3 < uVar4) && (lVar6 + lVar8 < (long)(this->options_->max_file_size * 0x19))) {
      new_start.rep_._M_dataplus._M_p = (pointer)&new_start.rep_.field_2;
      new_start.rep_._M_string_length = 0;
      new_start.rep_.field_2._M_local_buf[0] = '\0';
      new_limit.rep_._M_dataplus._M_p = (pointer)&new_limit.rep_.field_2;
      new_limit.rep_._M_string_length = 0;
      new_limit.rep_.field_2._M_local_buf[0] = '\0';
      GetRange(this,&expanded0,&new_start,&new_limit);
      expanded1.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      expanded1.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      expanded1.
      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      Version::GetOverlappingInputs(this->current_,level + 1,&new_start,&new_limit,&expanded1);
      if ((long)expanded1.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)expanded1.
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start ==
          (long)c->inputs_[1].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)c->inputs_[1].
                super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                ._M_impl.super__Vector_impl_data._M_start) {
        uVar3 = (ulong)((long)expanded1.
                              super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)expanded1.
                             super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3;
        Log(this->options_->info_log,"Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n"
            ,(ulong)level,
            (ulong)((long)c->inputs_[0].
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)c->inputs_[0].
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3,uVar3,lVar5,lVar8,
            (ulong)((long)expanded0.
                          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)expanded0.
                         super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3,uVar3,lVar6,lVar8);
        std::__cxx11::string::_M_assign((string *)&smallest);
        std::__cxx11::string::_M_assign((string *)&largest);
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                  (compaction_files,&expanded0);
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                  (inputs,&expanded1);
        GetRange2(this,compaction_files,inputs,&all_start,&all_limit);
      }
      if (expanded1.
          super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(expanded1.
                        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)new_limit.rep_._M_dataplus._M_p != &new_limit.rep_.field_2) {
        operator_delete(new_limit.rep_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)new_start.rep_._M_dataplus._M_p != &new_start.rep_.field_2) {
        operator_delete(new_start.rep_._M_dataplus._M_p);
      }
    }
    if (expanded0.
        super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(expanded0.
                      super__Vector_base<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  if ((int)level < 5) {
    Version::GetOverlappingInputs(this->current_,level + 2,&all_start,&all_limit,&c->grandparents_);
  }
  if (largest.rep_._M_string_length == 0) {
    __assert_fail("!rep_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/dbformat.h"
                  ,0x96,"Slice leveldb::InternalKey::Encode() const");
  }
  paVar1 = &new_start.rep_.field_2;
  new_start.rep_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&new_start,largest.rep_._M_dataplus._M_p,
             largest.rep_._M_dataplus._M_p + largest.rep_._M_string_length);
  std::__cxx11::string::operator=
            ((string *)(this->compact_pointer_ + (int)level),(string *)&new_start);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)new_start.rep_._M_dataplus._M_p != paVar1) {
    operator_delete(new_start.rep_._M_dataplus._M_p);
  }
  VersionEdit::SetCompactPointer(&c->edit_,level,&largest);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)all_limit.rep_._M_dataplus._M_p != &all_limit.rep_.field_2) {
    operator_delete(all_limit.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)all_start.rep_._M_dataplus._M_p != &all_start.rep_.field_2) {
    operator_delete(all_start.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)largest.rep_._M_dataplus._M_p != &largest.rep_.field_2) {
    operator_delete(largest.rep_._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)smallest.rep_._M_dataplus._M_p != &smallest.rep_.field_2) {
    operator_delete(smallest.rep_._M_dataplus._M_p);
  }
  return;
}

Assistant:

void VersionSet::SetupOtherInputs(Compaction* c) {
  const int level = c->level();
  InternalKey smallest, largest;

  AddBoundaryInputs(icmp_, current_->files_[level], &c->inputs_[0]);
  GetRange(c->inputs_[0], &smallest, &largest);

  current_->GetOverlappingInputs(level + 1, &smallest, &largest,
                                 &c->inputs_[1]);

  // Get entire range covered by compaction
  InternalKey all_start, all_limit;
  GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);

  // See if we can grow the number of inputs in "level" without
  // changing the number of "level+1" files we pick up.
  if (!c->inputs_[1].empty()) {
    std::vector<FileMetaData*> expanded0;
    current_->GetOverlappingInputs(level, &all_start, &all_limit, &expanded0);
    AddBoundaryInputs(icmp_, current_->files_[level], &expanded0);
    const int64_t inputs0_size = TotalFileSize(c->inputs_[0]);
    const int64_t inputs1_size = TotalFileSize(c->inputs_[1]);
    const int64_t expanded0_size = TotalFileSize(expanded0);
    if (expanded0.size() > c->inputs_[0].size() &&
        inputs1_size + expanded0_size <
            ExpandedCompactionByteSizeLimit(options_)) {
      InternalKey new_start, new_limit;
      GetRange(expanded0, &new_start, &new_limit);
      std::vector<FileMetaData*> expanded1;
      current_->GetOverlappingInputs(level + 1, &new_start, &new_limit,
                                     &expanded1);
      if (expanded1.size() == c->inputs_[1].size()) {
        Log(options_->info_log,
            "Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",
            level, int(c->inputs_[0].size()), int(c->inputs_[1].size()),
            long(inputs0_size), long(inputs1_size), int(expanded0.size()),
            int(expanded1.size()), long(expanded0_size), long(inputs1_size));
        smallest = new_start;
        largest = new_limit;
        c->inputs_[0] = expanded0;
        c->inputs_[1] = expanded1;
        GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);
      }
    }
  }

  // Compute the set of grandparent files that overlap this compaction
  // (parent == level+1; grandparent == level+2)
  if (level + 2 < config::kNumLevels) {
    current_->GetOverlappingInputs(level + 2, &all_start, &all_limit,
                                   &c->grandparents_);
  }

  // Update the place where we will do the next compaction for this level.
  // We update this immediately instead of waiting for the VersionEdit
  // to be applied so that if the compaction fails, we will try a different
  // key range next time.
  compact_pointer_[level] = largest.Encode().ToString();
  c->edit_.SetCompactPointer(level, largest);
}